

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O2

Box ftxui::Box::Intersection(Box a,Box b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  Box BVar5;
  
  uVar3 = b._0_8_ & 0xffffffff;
  if (b.x_min < a.x_min) {
    uVar3 = (ulong)(uint)a.x_min;
  }
  uVar1 = a._0_8_;
  if (b.x_max < a.x_max) {
    uVar1 = b._0_8_;
  }
  uVar4 = b._8_8_ & 0xffffffff;
  if (b.y_min < a.y_min) {
    uVar4 = (ulong)(uint)a.y_min;
  }
  uVar2 = a._8_8_;
  if (b.y_max < a.y_max) {
    uVar2 = b._8_8_;
  }
  BVar5._0_8_ = uVar3 | uVar1 & 0xffffffff00000000;
  uVar4 = uVar4 | uVar2 & 0xffffffff00000000;
  BVar5.y_min = (int)uVar4;
  BVar5.y_max = (int)(uVar4 >> 0x20);
  return BVar5;
}

Assistant:

Box Box::Intersection(Box a, Box b) {
  return Box{
      std::max(a.x_min, b.x_min),
      std::min(a.x_max, b.x_max),
      std::max(a.y_min, b.y_min),
      std::min(a.y_max, b.y_max),
  };
}